

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_restore_sb_state
               (SB_FIRST_PASS_STATS *sb_fp_stats,AV1_COMP *cpi,ThreadData_conflict *td,
               TileDataEnc *tile_data,int mi_row,int mi_col)

{
  SequenceHeader *pSVar1;
  
  pSVar1 = (cpi->common).seq_params;
  av1_restore_context(&td->mb,&sb_fp_stats->x_ctx,mi_row,mi_col,pSVar1->sb_size,
                      (uint)(pSVar1->monochrome == '\0') * 2 + 1);
  memcpy(&td->rd_counts,&sb_fp_stats->rd_count,0x598);
  (td->mb).txfm_search_info.txb_split_count = sb_fp_stats->split_count;
  memcpy(td->counts,&sb_fp_stats->fc,0xc0);
  if ((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(tile_data->inter_mode_rd_models,sb_fp_stats->inter_mode_rd_models,0x9a0);
  }
  memcpy((td->mb).thresh_freq_fact,sb_fp_stats->thresh_freq_fact,0x3a18);
  (cpi->common).mi_params.mi_alloc
  [(mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [(cpi->common).mi_params.mi_alloc_bsize]) *
   (cpi->common).mi_params.mi_alloc_stride +
   mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [(cpi->common).mi_params.mi_alloc_bsize]].current_qindex =
       sb_fp_stats->current_qindex;
  return;
}

Assistant:

void av1_restore_sb_state(const SB_FIRST_PASS_STATS *sb_fp_stats, AV1_COMP *cpi,
                          ThreadData *td, TileDataEnc *tile_data, int mi_row,
                          int mi_col) {
  MACROBLOCK *x = &td->mb;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  av1_restore_context(x, &sb_fp_stats->x_ctx, mi_row, mi_col, sb_size,
                      num_planes);

  td->rd_counts = sb_fp_stats->rd_count;
  x->txfm_search_info.txb_split_count = sb_fp_stats->split_count;

  *td->counts = sb_fp_stats->fc;

  if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(tile_data->inter_mode_rd_models, sb_fp_stats->inter_mode_rd_models,
           sizeof(sb_fp_stats->inter_mode_rd_models));
  }

  memcpy(x->thresh_freq_fact, sb_fp_stats->thresh_freq_fact,
         sizeof(sb_fp_stats->thresh_freq_fact));

  const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
  cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex =
      sb_fp_stats->current_qindex;

#if CONFIG_INTERNAL_STATS
  memcpy(cpi->mode_chosen_counts, sb_fp_stats->mode_chosen_counts,
         sizeof(sb_fp_stats->mode_chosen_counts));
#endif  // CONFIG_INTERNAL_STATS
}